

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void processIncludeDirectories
               (cmTarget *tgt,
               vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *includes,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  bool bVar1;
  pointer ppTVar2;
  cmTarget *pcVar3;
  cmMakefile *pcVar4;
  bool bVar5;
  PolicyStatus PVar6;
  char *pcVar7;
  ostream *poVar8;
  cmake *this;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar9;
  pointer ppTVar10;
  pointer path;
  char cVar11;
  allocator local_2b9;
  cmTarget *local_2b8;
  cmLinkImplItem *local_2b0;
  string local_2a8;
  cmMakefile *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  string usedIncludes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string inc;
  
  local_288 = tgt->Makefile;
  ppTVar10 = (entries->
             super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (entries->
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_280 = &tgt->Name;
  local_2b8 = tgt;
  do {
    if (ppTVar10 == ppTVar2) {
      return;
    }
    local_2b0 = (*ppTVar10)->LinkImplItem;
    pcVar3 = (local_2b0->super_cmLinkItem).Target;
    if (pcVar3 == (cmTarget *)0x0) {
      cVar11 = '\0';
    }
    else {
      cVar11 = pcVar3->IsImportedTarget;
    }
    bVar1 = local_2b0->FromGenex;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (((*ppTVar10)->ge).x_,local_288,config,false,local_2b8,dagChecker,language);
    std::__cxx11::string::string((string *)&inc,pcVar7,(allocator *)&usedIncludes);
    cmSystemTools::ExpandListArgument(&inc,&entryIncludes,false);
    std::__cxx11::string::~string((string *)&inc);
    usedIncludes._M_dataplus._M_p = (pointer)&usedIncludes.field_2;
    usedIncludes._M_string_length = 0;
    usedIncludes.field_2._M_local_buf[0] = '\0';
    for (path = entryIncludes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        path != entryIncludes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
      if ((cVar11 != '\0') &&
         (bVar5 = cmsys::SystemTools::FileExists((path->_M_dataplus)._M_p), !bVar5)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&inc);
        MVar9 = FATAL_ERROR;
        if (bVar1 != false) {
          PVar6 = cmTarget::GetPolicyStatusCMP0027(local_2b8);
          if (PVar6 != OLD) {
            if (PVar6 != WARN) goto LAB_002bffc8;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2a8,(cmPolicies *)0x1b,id_00);
            poVar8 = std::operator<<((ostream *)&inc,(string *)&local_2a8);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&local_2a8);
          }
          MVar9 = AUTHOR_WARNING;
        }
LAB_002bffc8:
        poVar8 = std::operator<<((ostream *)&inc,"Imported target \"");
        poVar8 = std::operator<<(poVar8,(string *)local_2b0);
        poVar8 = std::operator<<(poVar8,"\" includes non-existent path\n  \"");
        poVar8 = std::operator<<(poVar8,(string *)path);
        std::operator<<(poVar8,
                        "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                       );
        pcVar4 = local_2b8->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar4,MVar9,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        goto LAB_002c0049;
      }
      bVar5 = cmsys::SystemTools::FileIsFullPath((path->_M_dataplus)._M_p);
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&inc);
        if ((local_2b0->super_cmLinkItem).super_string._M_string_length == 0) {
          PVar6 = cmTarget::GetPolicyStatusCMP0021(local_2b8);
          if (PVar6 == OLD) {
            bVar5 = true;
LAB_002bfd28:
            MVar9 = FATAL_ERROR;
          }
          else {
            if (PVar6 != WARN) {
              bVar5 = false;
              goto LAB_002bfd28;
            }
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2a8,(cmPolicies *)0x15,id);
            poVar8 = std::operator<<((ostream *)&inc,(string *)&local_2a8);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&local_2a8);
            bVar5 = false;
            MVar9 = AUTHOR_WARNING;
          }
          poVar8 = std::operator<<((ostream *)&inc,
                                   "Found relative path while evaluating include directories of \"")
          ;
          poVar8 = std::operator<<(poVar8,(string *)local_280);
          poVar8 = std::operator<<(poVar8,"\":\n  \"");
          poVar8 = std::operator<<(poVar8,(string *)path);
          std::operator<<(poVar8,"\"\n");
          if (!bVar5) goto LAB_002bfd75;
        }
        else {
          poVar8 = std::operator<<((ostream *)&inc,"Target \"");
          poVar8 = std::operator<<(poVar8,(string *)local_2b0);
          poVar8 = std::operator<<(poVar8,
                                   "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \""
                                  );
          poVar8 = std::operator<<(poVar8,(string *)path);
          std::operator<<(poVar8,"\"");
          MVar9 = FATAL_ERROR;
LAB_002bfd75:
          pcVar4 = local_2b8->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar4,MVar9,&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          if (MVar9 != AUTHOR_WARNING) {
LAB_002c0049:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inc);
            std::__cxx11::string::~string((string *)&usedIncludes);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&entryIncludes);
            return;
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inc);
      }
      bVar5 = cmSystemTools::IsOff((path->_M_dataplus)._M_p);
      if (!bVar5) {
        cmsys::SystemTools::ConvertToUnixSlashes(path);
      }
      std::__cxx11::string::string((string *)&inc,(string *)path);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)&local_2a8,uniqueIncludes,(value_type *)&inc);
      if ((local_2a8.field_2._M_local_buf[0] == '\x01') &&
         (std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(includes,(value_type *)&inc), debugIncludes)) {
        std::operator+(&local_208," * ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inc);
        std::operator+(&local_2a8,&local_208,"\n");
        std::__cxx11::string::append((string *)&usedIncludes);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_208);
      }
      std::__cxx11::string::~string((string *)&inc);
    }
    if (usedIncludes._M_string_length != 0) {
      this = cmMakefile::GetCMakeInstance(local_288);
      std::__cxx11::string::string((string *)&local_1e8,"Used includes for target ",&local_2b9);
      std::operator+(&local_1c8,&local_1e8,local_280);
      std::operator+(&local_208,&local_1c8,":\n");
      std::operator+(&local_2a8,&local_208,&usedIncludes);
      cmListFileBacktrace::cmListFileBacktrace
                ((cmListFileBacktrace *)&inc,&(((*ppTVar10)->ge).x_)->Backtrace);
      cmake::IssueMessage(this,LOG,&local_2a8,(cmListFileBacktrace *)&inc);
      std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)&inc);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    std::__cxx11::string::~string((string *)&usedIncludes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&entryIncludes);
    ppTVar10 = ppTVar10 + 1;
  } while( true );
}

Assistant:

static void processIncludeDirectories(cmTarget const* tgt,
      const std::vector<cmTargetInternals::TargetPropertyEntry*> &entries,
      std::vector<std::string> &includes,
      UNORDERED_SET<std::string> &uniqueIncludes,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugIncludes,
      const std::string& language)
{
  cmMakefile *mf = tgt->GetMakefile();

  for (std::vector<cmTargetInternals::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(mf,
                                              config,
                                              false,
                                              tgt,
                                              dagChecker, language),
                                    entryIncludes);

    std::string usedIncludes;
    for(std::vector<std::string>::iterator
          li = entryIncludes.begin(); li != entryIncludes.end(); ++li)
      {
      if (fromImported
          && !cmSystemTools::FileExists(li->c_str()))
        {
        std::ostringstream e;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (checkCMP0027)
          {
          switch(tgt->GetPolicyStatusCMP0027())
            {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
            case cmPolicies::OLD:
              messageType = cmake::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
            }
          }
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << *li << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        tgt->GetMakefile()->IssueMessage(messageType, e.str());
        return;
        }

      if (!cmSystemTools::FileIsFullPath(li->c_str()))
        {
        std::ostringstream e;
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (!targetName.empty())
          {
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << *li << "\"";
          }
        else
          {
          switch(tgt->GetPolicyStatusCMP0021())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }
          e << "Found relative path while evaluating include directories of "
          "\"" << tgt->GetName() << "\":\n  \"" << *li << "\"\n";
          }
        if (!noMessage)
          {
          tgt->GetMakefile()->IssueMessage(messageType, e.str());
          if (messageType == cmake::FATAL_ERROR)
            {
            return;
            }
          }
        }

      if (!cmSystemTools::IsOff(li->c_str()))
        {
        cmSystemTools::ConvertToUnixSlashes(*li);
        }
      std::string inc = *li;

      if(uniqueIncludes.insert(inc).second)
        {
        includes.push_back(inc);
        if (debugIncludes)
          {
          usedIncludes += " * " + inc + "\n";
          }
        }
      }
    if (!usedIncludes.empty())
      {
      mf->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used includes for target ")
                            + tgt->GetName() + ":\n"
                            + usedIncludes, (*it)->ge->GetBacktrace());
      }
    }
}